

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O3

int ASN1_STRING_copy(ASN1_STRING *dst,ASN1_STRING *str)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (str != (ASN1_STRING *)0x0) {
    iVar1 = ASN1_STRING_set(dst,str->data,str->length);
    iVar2 = 0;
    if (iVar1 != 0) {
      dst->type = str->type;
      dst->flags = str->flags;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int ASN1_STRING_copy(ASN1_STRING *dst, const ASN1_STRING *str) {
  if (str == NULL) {
    return 0;
  }
  if (!ASN1_STRING_set(dst, str->data, str->length)) {
    return 0;
  }
  dst->type = str->type;
  dst->flags = str->flags;
  return 1;
}